

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsValidBasePointer(Instruction *this)

{
  Op OVar1;
  bool bVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  FeatureManager *pFVar6;
  CapabilitySet *this_00;
  
  uVar3 = type_id(this);
  if (uVar3 != 0) {
    pDVar4 = IRContext::get_def_use_mgr(this->context_);
    pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
    if (pIVar5->opcode_ == OpTypePointer) {
      pFVar6 = IRContext::get_feature_mgr(this->context_);
      this_00 = &pFVar6->capabilities_;
      bVar2 = EnumSet<spv::Capability>::contains(this_00,Addresses);
      if (bVar2) {
        return true;
      }
      if (this->opcode_ == OpFunctionParameter) {
        return true;
      }
      if (this->opcode_ == OpVariable) {
        return true;
      }
      uVar3 = GetSingleWordInOperand(pIVar5,0);
      bVar2 = EnumSet<spv::Capability>::contains(this_00,CapabilityVariablePointersStorageBuffer);
      if (((bVar2) && (uVar3 == 0xc)) ||
         ((bVar2 = EnumSet<spv::Capability>::contains(this_00,CapabilityVariablePointers),
          uVar3 == 4 && (bVar2)))) {
        OVar1 = this->opcode_;
        if (OVar1 == OpConstantNull) {
          return true;
        }
        if (OVar1 == OpFunctionCall) {
          return true;
        }
        if (OVar1 == OpSelect) {
          return true;
        }
        if (OVar1 == OpPhi) {
          return true;
        }
      }
      uVar3 = GetSingleWordInOperand(pIVar5,1);
      pDVar4 = IRContext::get_def_use_mgr(this->context_);
      pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
      bVar2 = IsOpaqueType(pIVar5);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsValidBasePointer() const {
  uint32_t tid = type_id();
  if (tid == 0) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(tid);
  if (type->opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  auto feature_mgr = context()->get_feature_mgr();
  if (feature_mgr->HasCapability(spv::Capability::Addresses)) {
    // TODO: The rules here could be more restrictive.
    return true;
  }

  if (opcode() == spv::Op::OpVariable ||
      opcode() == spv::Op::OpFunctionParameter) {
    return true;
  }

  // With variable pointers, there are more valid base pointer objects.
  // Variable pointers implicitly declares Variable pointers storage buffer.
  spv::StorageClass storage_class =
      static_cast<spv::StorageClass>(type->GetSingleWordInOperand(0));
  if ((feature_mgr->HasCapability(
           spv::Capability::VariablePointersStorageBuffer) &&
       storage_class == spv::StorageClass::StorageBuffer) ||
      (feature_mgr->HasCapability(spv::Capability::VariablePointers) &&
       storage_class == spv::StorageClass::Workgroup)) {
    switch (opcode()) {
      case spv::Op::OpPhi:
      case spv::Op::OpSelect:
      case spv::Op::OpFunctionCall:
      case spv::Op::OpConstantNull:
        return true;
      default:
        break;
    }
  }

  uint32_t pointee_type_id = type->GetSingleWordInOperand(1);
  Instruction* pointee_type_inst =
      context()->get_def_use_mgr()->GetDef(pointee_type_id);

  if (pointee_type_inst->IsOpaqueType()) {
    return true;
  }
  return false;
}